

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_>::erase
          (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *this,Bucket bucket)

{
  byte bVar1;
  Span<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *pSVar2;
  ulong uVar3;
  Span<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *pSVar4;
  Span<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *pSVar5;
  size_t bucket_00;
  Span<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *this_00;
  Span<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *this_01;
  size_t fromIndex;
  QByteArrayView QVar6;
  
  bucket_00 = bucket.index;
  this_00 = bucket.span;
  Span<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_>::erase(this_00,bucket_00);
  this->size = this->size - 1;
  this_01 = this_00;
  fromIndex = bucket_00;
  do {
    pSVar2 = this->spans;
    fromIndex = fromIndex + 1;
    if (fromIndex == 0x80) {
      this_00 = this_00 + 1;
      if (((long)this_00 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) == 0)
      {
        this_00 = pSVar2;
      }
      fromIndex = 0;
    }
    bVar1 = this_00->offsets[fromIndex];
    if (bVar1 != 0xff) {
      QVar6.m_data = *(storage_type **)(this_00->entries[bVar1].storage.data + 8);
      QVar6.m_size = *(qsizetype *)(this_00->entries[bVar1].storage.data + 0x10);
      uVar3 = qHash(QVar6,this->seed);
      uVar3 = this->numBuckets - 1 & uVar3;
      pSVar4 = pSVar2 + (uVar3 >> 7);
      uVar3 = (ulong)((uint)uVar3 & 0x7f);
      if (uVar3 != fromIndex || pSVar4 != this_00) {
        do {
          if ((pSVar4 == this_01) && (uVar3 == bucket_00)) {
            if (this_00 == this_01) {
              this_01->offsets[bucket_00] = this_01->offsets[fromIndex];
              this_01->offsets[fromIndex] = 0xff;
              bucket_00 = fromIndex;
              this_01 = this_00;
            }
            else {
              Span<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_>::moveFromSpan
                        (this_01,this_00,fromIndex,bucket_00);
              bucket_00 = fromIndex;
              this_01 = this_00;
            }
            break;
          }
          uVar3 = uVar3 + 1;
          if (uVar3 == 0x80) {
            pSVar5 = pSVar4 + 1;
            pSVar4 = pSVar2;
            if (((long)pSVar5 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
                != 0) {
              pSVar4 = pSVar5;
            }
            uVar3 = 0;
          }
        } while ((pSVar4 != this_00) || (uVar3 != fromIndex));
      }
    }
    if (bVar1 == 0xff) {
      return;
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }